

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

wchar_t path_nearest_unknown(player *p,loc start,loc *dest_grid,int16_t **step_dirs)

{
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc grid_05;
  loc grid_06;
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  loc lVar5;
  wchar_t path_length;
  wchar_t turns;
  loc test_grid;
  loc grid;
  wchar_t min_turns;
  loc min_grid;
  pfdistances *distances;
  _Bool passable;
  _Bool forbid_traps;
  _Bool only_known;
  int16_t **step_dirs_local;
  loc *dest_grid_local;
  player *p_local;
  loc start_local;
  
  _Var3 = true;
  distances._6_1_ = true;
  bVar1 = true;
  do {
    min_grid.x = 0;
    min_grid.y = 0;
    register0x00000000 = (loc_conflict)loc(-1,-1);
    grid.x = 0x7fffffff;
    for (test_grid.y = 0; test_grid.y < p->cave->height; test_grid.y = test_grid.y + 1) {
      for (test_grid.x = 0; test_grid.x < p->cave->width; test_grid.x = test_grid.x + 1) {
        lVar5.y = test_grid.y;
        lVar5.x = test_grid.x;
        _Var2 = loc_eq(lVar5,start);
        if ((!_Var2) &&
           (grid_00.y = test_grid.y, grid_00.x = test_grid.x,
           _Var2 = square_isknown((chunk *)p->cave,grid_00), _Var2)) {
          if (bVar1) {
            grid_01.y = test_grid.y;
            grid_01.x = test_grid.x;
            _Var2 = square_ispassable((chunk *)p->cave,grid_01);
            if ((_Var2) &&
               (grid_02.y = test_grid.y, grid_02.x = test_grid.x,
               wVar4 = count_neighbors((loc *)0x0,(chunk_conflict *)p->cave,grid_02,square_isknown,
                                       false), wVar4 != L'\b')) {
              unique0x100001fc = test_grid.y;
              path_length = test_grid.x;
LAB_001e8402:
              if (min_grid == (loc)0x0) {
                min_grid = (loc)prepare_pfdistances(p,start,_Var3,distances._6_1_);
              }
              wVar4 = pfdistances_to_turncount((pfdistances *)min_grid,(loc)_path_length);
              if ((L'\0' < wVar4) && (wVar4 < grid.x)) {
                stack0xffffffffffffffb8 = _path_length;
                grid.x = wVar4;
              }
            }
          }
          else {
            grid_03.y = test_grid.y;
            grid_03.x = test_grid.x;
            _Var2 = square_iscloseddoor((chunk *)p->cave,grid_03);
            if ((((_Var2) ||
                 (grid_04.y = test_grid.y, grid_04.x = test_grid.x,
                 _Var2 = square_isrubble((chunk *)p->cave,grid_04), _Var2)) &&
                (grid_05.y = test_grid.y, grid_05.x = test_grid.x,
                wVar4 = count_neighbors((loc *)0x0,(chunk_conflict *)p->cave,grid_05,square_isknown,
                                        false), wVar4 != L'\b')) &&
               ((grid_06.y = test_grid.y, grid_06.x = test_grid.x,
                wVar4 = count_neighbors((loc *)&path_length,(chunk_conflict *)p->cave,grid_06,
                                        square_isknownpassable,false), wVar4 != L'\0' &&
                (_Var2 = loc_eq((loc)_path_length,start), !_Var2)))) goto LAB_001e8402;
          }
        }
      }
    }
    if (grid.x < 0x7fffffff) {
      if ((min_grid == (loc)0x0) ||
         (_Var3 = square_in_bounds((chunk *)p->cave,stack0xffffffffffffffb8), !_Var3)) {
        __assert_fail("distances && square_in_bounds(p->cave, min_grid)",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                      ,0x3e3,
                      "int path_nearest_unknown(struct player *, struct loc, struct loc *, int16_t **)"
                     );
      }
      if (dest_grid != (loc *)0x0) {
        dest_grid->x = grid.y;
        dest_grid->y = min_turns;
      }
      wVar4 = pfdistances_to_path((pfdistances *)min_grid,(loc)stack0xffffffffffffffb8,step_dirs);
      release_pfdistances((pfdistances *)min_grid);
      if (L'\0' < wVar4) {
        return wVar4;
      }
      __assert_fail("path_length > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-path.c"
                    ,0x3ea,
                    "int path_nearest_unknown(struct player *, struct loc, struct loc *, int16_t **)"
                   );
    }
    release_pfdistances((pfdistances *)min_grid);
    if ((distances._6_1_ == false) || (_Var2 = player_is_trapsafe(p), _Var2)) {
      if (_Var3 == false) {
        if (!bVar1) {
          if (dest_grid != (loc *)0x0) {
            lVar5 = loc(-1,-1);
            *dest_grid = lVar5;
          }
          if (step_dirs != (int16_t **)0x0) {
            *step_dirs = (int16_t *)0x0;
          }
          return L'\xffffffff';
        }
        bVar1 = false;
        _Var3 = true;
        distances._6_1_ = true;
      }
      else {
        _Var3 = false;
        distances._6_1_ = true;
      }
    }
    else {
      distances._6_1_ = false;
    }
  } while( true );
}

Assistant:

int path_nearest_unknown(struct player *p, struct loc start,
		struct loc *dest_grid, int16_t **step_dirs)
{
	bool only_known = true, forbid_traps = true, passable = true;

	while (1) {
		struct pfdistances *distances = NULL;
		struct loc min_grid = loc(-1, -1);
		int min_turns = INT_MAX;
		struct loc grid;

		for (grid.y = 0; grid.y < p->cave->height; ++grid.y) {
			for (grid.x = 0; grid.x < p->cave->width; ++grid.x) {
				struct loc test_grid;
				int turns;

				if (loc_eq(grid, start)
						|| !square_isknown(p->cave,
						grid)) {
					continue;
				}
				if (passable) {
					if (!square_ispassable(p->cave, grid)
							|| count_neighbors(NULL,
							p->cave, grid,
							square_isknown, false)
							== 8) {
						continue;
					}
					test_grid = grid;
				} else {
					if ((!square_iscloseddoor(p->cave, grid)
							&& !square_isrubble(
							p->cave, grid))
							|| count_neighbors(NULL,
							p->cave, grid,
							square_isknown,
							false) == 8) {
						continue;
					}
					if (count_neighbors(&test_grid,
							p->cave, grid,
							square_isknownpassable,
							false) == 0 ||
							loc_eq(test_grid,
							start)) {
						continue;
					}
				}

				if (!distances) {
					distances = prepare_pfdistances(
						p, start, only_known,
						forbid_traps);
				}
				turns = pfdistances_to_turncount(distances,
					test_grid);
				if (turns > 0 && min_turns > turns) {
					min_turns = turns;
					min_grid = test_grid;
				}
			}
		}

		if (min_turns < INT_MAX) {
			int path_length;

			assert(distances
				&& square_in_bounds(p->cave, min_grid));
			if (dest_grid) {
				*dest_grid = min_grid;
			}
			path_length = pfdistances_to_path(distances,
				min_grid, step_dirs);
			release_pfdistances(distances);
			assert(path_length > 0);
			return path_length;
		}

		release_pfdistances(distances);
		/*
		 * No destination was found.  Try looser constraints on the
		 * grids that can be in the path.
		 */
		if (forbid_traps && !player_is_trapsafe(p)) {
			forbid_traps = false;
			continue;
		}
		if (only_known) {
			only_known = false;
			forbid_traps = true;
			continue;
		}
		/*
		 * Looser constraints did not help.  Try looking for known
		 * closed doors or known rubble with unknown neighbors.
		 */
		if (passable) {
			passable = false;
			only_known = true;
			forbid_traps = true;
			continue;
		}
		/* Nothing more to try.  Give up. */
		if (dest_grid) {
			*dest_grid = loc(-1, -1);
		}
		if (step_dirs) {
			*step_dirs = NULL;
		}
		return -1;
	}
}